

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::set_allocated_int64tostringmap
          (CategoricalMapping *this,Int64ToStringMap *int64tostringmap)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_MappingType(this);
  if (int64tostringmap != (Int64ToStringMap *)0x0) {
    uVar1 = (int64tostringmap->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      int64tostringmap =
           (Int64ToStringMap *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&int64tostringmap->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 2;
    (this->MappingType_).int64tostringmap_ = int64tostringmap;
  }
  return;
}

Assistant:

void CategoricalMapping::set_allocated_int64tostringmap(::CoreML::Specification::Int64ToStringMap* int64tostringmap) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_MappingType();
  if (int64tostringmap) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(int64tostringmap));
    if (message_arena != submessage_arena) {
      int64tostringmap = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64tostringmap, submessage_arena);
    }
    set_has_int64tostringmap();
    MappingType_.int64tostringmap_ = int64tostringmap;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CategoricalMapping.int64ToStringMap)
}